

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall GlobOpt::NewGenericValue(GlobOpt *this,ValueType valueType,Opnd *opnd)

{
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 type;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *this_00;
  Value *value;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType valueType_local;
  
  local_2a[0] = valueType.field_0;
  bVar2 = ValueType::IsLikelyInt((ValueType *)&local_2a[0].field_0);
  if (opnd != (Opnd *)0x0 && bVar2) {
    bVar2 = IR::Opnd::IsNotInt(opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1068,"(!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt()))",
                         "!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt())");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  type = local_2a[0];
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,this->alloc,0x3eba5c);
  ValueInfo::ValueInfo(this_00,(ValueType)type.field_0,Generic);
  value = NewValue(this,this_00);
  TrackNewValueForKills(this,value);
  GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,value,opnd);
  return value;
}

Assistant:

Value *
GlobOpt::NewGenericValue(const ValueType valueType, IR::Opnd *const opnd)
{
    // Shouldn't assign a likely-int value to something that is definitely not an int
    Assert(!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt()));

    ValueInfo *valueInfo = ValueInfo::New(this->alloc, valueType);
    Value *val = NewValue(valueInfo);
    TrackNewValueForKills(val);

    CurrentBlockData()->InsertNewValue(val, opnd);
    return val;
}